

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int get_default_directory(AP_CTX *ctx)

{
  char *pcVar1;
  size_t sVar2;
  char *dst;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "Can not get HOME environment variable\n";
  }
  else {
    if (*pcVar1 != '\0') {
      sVar2 = strlen(pcVar1);
      sVar2 = sVar2 + 7;
      dst = (char *)calloc(1,sVar2);
      ctx->default_dir = dst;
      ap_str_strlcpy(dst,pcVar1,sVar2);
      ap_str_strlcat(ctx->default_dir,"/.ssh",sVar2);
      return 0;
    }
    pcVar1 = "Empty HOME environment variable\n";
  }
  ap_log(AP_LOG_LEVEL_ERROR,pcVar1);
  if (ctx->default_dir != (char *)0x0) {
    free(ctx->default_dir);
  }
  return 6;
}

Assistant:

static int get_default_directory (AP_CTX *ctx)
{
	int			rc					= AP_NO_ERROR;
	const char	*var				= NULL;
	size_t		size;

#	if defined (_WIN32)
	var = getenv ("USERPROFILE"); 
#	else
	var = getenv ("HOME"); 
#	endif
	if (var == NULL)
	{
		ap_error ("Can not get HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	if (*var == '\0')
	{
		ap_error ("Empty HOME environment variable\n");
		rc = AP_ERROR_ENVIRONMENT;

		goto finish;
	}

	size = strlen (var) + sizeof ("/.ssh") + 1;

	ctx->default_dir = calloc (1, size);
	if (rc != AP_NO_ERROR)
	{
		ap_error ("Can not allocate memory for 'dir'\n");
		rc = AP_ERROR_NO_MEMORY;

		goto finish;
	}

	ap_str_strlcpy (ctx->default_dir, var, size);
	ap_str_strlcat (ctx->default_dir, "/.ssh", size);

finish:
	if (rc != AP_NO_ERROR)
	{
		if (ctx->default_dir != NULL)
		{
			free (ctx->default_dir);
		}
	}

	return rc;
}